

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O3

QString * convertToUnicode(QString *__return_storage_ptr__,QString *asciiDomain,
                          AceProcessingOptions options)

{
  Data *pDVar1;
  bool bVar2;
  qsizetype qVar3;
  long lVar4;
  long from;
  long in_FS_OFFSET;
  QString local_98;
  QString local_78;
  DomainValidityChecker local_5b;
  QString local_58;
  QString *local_38;
  
  local_38 = *(QString **)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  QString::reallocData(&local_58,(asciiDomain->d).size,KeepSize);
  if ((&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) &&
     (*(qsizetype *)((long)local_58.d.d + 8) != 0)) {
    *(byte *)&(((ArrayOptions *)((long)local_58.d.d + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_58.d.d + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  local_5b.domainNameIsBidi = false;
  local_5b.hadBidiErrors = false;
  local_5b.ignoreBidiErrors = false;
  from = 0;
  do {
    qVar3 = QString::indexOf(asciiDomain,(QChar)0x2e,from,CaseSensitive);
    lVar4 = (asciiDomain->d).size;
    if (qVar3 == -1) {
      qVar3 = lVar4;
    }
    if (qVar3 - from == 0) {
      if (from == lVar4) {
LAB_00264920:
        (__return_storage_ptr__->d).d = local_58.d.d;
        (__return_storage_ptr__->d).ptr = local_58.d.ptr;
        (__return_storage_ptr__->d).size = local_58.d.size;
LAB_002649c5:
        if (*(QString **)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return *(QString **)(in_FS_OFFSET + 0x28);
      }
    }
    else {
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString(&local_78,(QChar *)((asciiDomain->d).ptr + from),qVar3 - from);
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      qt_punycodeDecoder(&local_98,&local_78);
      if (((undefined1 *)local_98.d.size == (undefined1 *)0x0) ||
         (bVar2 = anon_unknown.dwarf_538cc0::DomainValidityChecker::checkLabel
                            (&local_5b,&local_98,options), !bVar2)) {
        pDVar1 = (asciiDomain->d).d;
        (__return_storage_ptr__->d).d = pDVar1;
        (__return_storage_ptr__->d).ptr = (asciiDomain->d).ptr;
        (__return_storage_ptr__->d).size = (asciiDomain->d).size;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_002649c5;
      }
      QString::append(&local_58,&local_98);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar4 = (asciiDomain->d).size;
    }
    if (qVar3 == lVar4) goto LAB_00264920;
    QString::append(&local_58,(QChar)0x2e);
    from = qVar3 + 1;
  } while( true );
}

Assistant:

static QString convertToUnicode(const QString &asciiDomain, QUrl::AceProcessingOptions options)
{
    QString result;
    result.reserve(asciiDomain.size());
    qsizetype lastIdx = 0;

    DomainValidityChecker checker;

    while (true) {
        auto idx = asciiDomain.indexOf(u'.', lastIdx);
        if (idx == -1)
            idx = asciiDomain.size();

        const auto labelLength = idx - lastIdx;
        if (labelLength == 0) {
            if (idx == asciiDomain.size())
                break;
        } else {
            const auto label = asciiDomain.sliced(lastIdx, labelLength);
            const auto unicodeLabel = qt_punycodeDecoder(label);

            if (unicodeLabel.isEmpty())
                return asciiDomain;

            if (!checker.checkLabel(unicodeLabel, options))
                return asciiDomain;

            result.append(unicodeLabel);
        }

        if (idx == asciiDomain.size())
            break;

        lastIdx = idx + 1;
        result += u'.';
    }
    return result;
}